

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_iterator.cpp
# Opt level: O1

iterator * __thiscall csv::CSVReader::begin(iterator *__return_storage_ptr__,CSVReader *this)

{
  ThreadSafeDeque<csv::CSVRow> *pTVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  thread local_50;
  CSVRow local_48;
  CSVReader *local_20;
  
  pTVar1 = (this->records)._M_t.
           super___uniq_ptr_impl<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
           .super__Head_base<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_false>.
           _M_head_impl;
  if (((iterator *)
      ((long)&(pTVar1->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_> + 0x30))->
      _M_cur == ((iterator *)
                ((long)&(pTVar1->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>
                + 0x10))->_M_cur) {
    local_48.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)read_csv;
    local_48.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_20 = this;
    std::thread::
    thread<bool(csv::CSVReader::*)(unsigned_long),csv::CSVReader*,unsigned_long_const&,void>
              (&local_50,(offset_in_CSVReader_to_subr *)&local_48,&local_20,
               &internals::ITERATION_CHUNK_SIZE);
    if ((this->read_csv_worker)._M_id._M_thread != 0) {
      std::terminate();
    }
    (this->read_csv_worker)._M_id._M_thread = (native_handle_type)local_50._M_id._M_thread;
    std::thread::join();
    pTVar1 = (this->records)._M_t.
             super___uniq_ptr_impl<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
             .super__Head_base<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_false>.
             _M_head_impl;
    if (((iterator *)
        ((long)&(pTVar1->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_> + 0x30))
        ->_M_cur ==
        ((iterator *)
        ((long)&(pTVar1->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_> + 0x10))
        ->_M_cur) {
      (__return_storage_ptr__->row).fields_start = 0;
      (__return_storage_ptr__->row).row_length = 0;
      (__return_storage_ptr__->row).data.
      super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->row).data_start = 0;
      __return_storage_ptr__->daddy = (CSVReader *)0x0;
      (__return_storage_ptr__->row).data.
      super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      __return_storage_ptr__->i = 0;
      return __return_storage_ptr__;
    }
  }
  this->_n_rows = this->_n_rows + 1;
  internals::ThreadSafeDeque<csv::CSVRow>::pop_front
            (&local_48,
             (this->records)._M_t.
             super___uniq_ptr_impl<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
             .super__Head_base<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_false>.
             _M_head_impl);
  _Var3._M_pi = local_48.data.
                super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  peVar2 = local_48.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  __return_storage_ptr__->daddy = this;
  (__return_storage_ptr__->row).data.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->row).data.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->row).data_start = 0;
  (__return_storage_ptr__->row).fields_start = 0;
  (__return_storage_ptr__->row).row_length = 0;
  __return_storage_ptr__->i = 0;
  local_48.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (__return_storage_ptr__->row).data.
            super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (__return_storage_ptr__->row).data.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (__return_storage_ptr__->row).data.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (__return_storage_ptr__->row).row_length = local_48.row_length;
  (__return_storage_ptr__->row).data_start = local_48.data_start;
  (__return_storage_ptr__->row).fields_start = local_48.fields_start;
  if (local_48.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.data.
               super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE CSVReader::iterator CSVReader::begin() {
        if (this->records->empty()) {
            this->read_csv_worker = std::thread(&CSVReader::read_csv, this, internals::ITERATION_CHUNK_SIZE);
            this->read_csv_worker.join();

            // Still empty => return end iterator
            if (this->records->empty()) return this->end();
        }

        this->_n_rows++;
        CSVReader::iterator ret(this, this->records->pop_front());
        return ret;
    }